

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O3

void set_multi_layer_params_for_fp
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int depth_thr,int *cur_disp_idx,
               int layer_depth)

{
  int *piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  FRAME_INFO *frame_info_00;
  int *piVar12;
  uint uVar13;
  int iVar14;
  bool bVar15;
  int iVar16;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  undefined4 in_stack_0000004c;
  int in_stack_ffffffffffffff38;
  int local_78 [8];
  uint local_58 [6];
  ulong local_40;
  int (*local_38) [8];
  
  frame_info_00 = (FRAME_INFO *)((ulong)frame_info & 0xffffffff);
  piVar12 = (int *)CONCAT44(in_stack_00000014,end);
  if (start - (int)frame_info < 3 || gf_group->max_layer_depth_allowed < (int)(uint)cur_disp_idx) {
    uVar10 = (ulong)frame_info & 0xffffffff;
    uVar11 = (uint)cur_disp_idx;
  }
  else {
    uVar3 = (uint)first_frame_index;
    if ((int)(uint)first_frame_index < (int)(uint)cur_disp_idx) {
      uVar3 = (uint)cur_disp_idx;
    }
    do {
      uVar11 = (uint)frame_info_00;
      iVar4 = (int)(start + -1 + uVar11) / 2;
      gf_group->update_type[*cur_frame_idx] = '\x06';
      gf_group->arf_src_offset[*cur_frame_idx] = (uchar)(iVar4 - uVar11);
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar12;
      gf_group->layer_depth[*cur_frame_idx] = (uint)cur_disp_idx;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      gf_group->display_idx[*cur_frame_idx] =
           (uint)gf_group->arf_src_offset[*cur_frame_idx] +
           *(int *)CONCAT44(in_stack_0000004c,depth_thr);
      iVar14 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,iVar4,start - iVar4,
                                  iVar4 - uVar11,(int *)0x0,(int *)0x0,0);
      gf_group->arf_boost[*cur_frame_idx] = iVar14;
      if ((max_parallel_frames != 0) && (*frame_ind <= (int)parallel_frame_count && 1 < *frame_ind))
      {
        if (gf_group->arf_src_offset[*cur_frame_idx] < 7) {
          gf_group->frame_parallel_level[*cur_frame_idx] = 2;
        }
        *frame_ind = 1;
      }
      iVar14 = *cur_frame_idx;
      piVar12 = (int *)CONCAT44(in_stack_00000014,end);
      if (0 < gf_group->frame_parallel_level[iVar14]) {
        iVar6 = *piVar12;
        if (gf_group->frame_parallel_level[iVar14] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
          iVar7 = iVar6;
        }
        else {
          iVar7 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        }
        gf_group->src_offset[iVar14] = (iVar6 - iVar7) + (uint)gf_group->arf_src_offset[iVar14];
        iVar14 = *cur_frame_idx;
      }
      iVar14 = iVar14 + 1;
      *cur_frame_idx = iVar14;
      if (uVar3 == (uint)cur_disp_idx) {
        uVar9 = (int)(((iVar4 + uVar11) - ((int)(iVar4 + uVar11 + -1) >> 0x1f)) + -1) >> 1;
        local_40 = (ulong)uVar9;
        uVar13 = (start + iVar4 + 1) / 2;
        iVar16 = uVar3 + 1;
        local_38 = gf_group->skip_frame_refresh;
        iVar6 = uVar9 - uVar11;
        iVar7 = iVar4 - uVar9;
        iVar8 = uVar9 - uVar11;
        bVar2 = true;
        do {
          bVar15 = bVar2;
          gf_group->update_type[iVar14] = '\x06';
          gf_group->arf_src_offset[*cur_frame_idx] = (uchar)iVar8;
          gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar12;
          gf_group->layer_depth[*cur_frame_idx] = iVar16;
          gf_group->frame_type[*cur_frame_idx] = '\x01';
          gf_group->refbuf_state[*cur_frame_idx] = '\x01';
          gf_group->display_idx[*cur_frame_idx] =
               (uint)gf_group->arf_src_offset[*cur_frame_idx] +
               *(int *)CONCAT44(in_stack_0000004c,depth_thr);
          iVar14 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,uVar9,iVar7,iVar6,
                                      (int *)0x0,(int *)0x0,0);
          gf_group->arf_boost[*cur_frame_idx] = iVar14;
          if (max_parallel_frames != 0) {
            if ((uint)first_frame_index != 0x7fffffff) {
              lVar5 = (long)*cur_frame_idx;
              if (gf_group->layer_depth[lVar5 + -1] == iVar16) {
                gf_group->frame_parallel_level[lVar5] = 2;
                local_38[*cur_frame_idx][0] = gf_group->display_idx[(long)*cur_frame_idx + -1];
                local_38[*cur_frame_idx][1] = gf_group->display_idx[(long)*cur_frame_idx + -2];
                gf_group->skip_frame_as_ref[*cur_frame_idx] =
                     gf_group->display_idx[(long)*cur_frame_idx + -1];
              }
              else {
                gf_group->frame_parallel_level[lVar5] = 1;
              }
            }
            if (*frame_ind <= (int)parallel_frame_count && 1 < *frame_ind) {
              if (gf_group->arf_src_offset[*cur_frame_idx] < 7) {
                gf_group->frame_parallel_level[*cur_frame_idx] = 2;
              }
              *frame_ind = 1;
            }
          }
          iVar14 = *cur_frame_idx;
          piVar12 = (int *)CONCAT44(in_stack_00000014,end);
          if (0 < gf_group->frame_parallel_level[iVar14]) {
            iVar6 = *piVar12;
            if (gf_group->frame_parallel_level[iVar14] == 1) {
              *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
              iVar7 = iVar6;
            }
            else {
              iVar7 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
            }
            gf_group->src_offset[iVar14] = (iVar6 - iVar7) + (uint)gf_group->arf_src_offset[iVar14];
            iVar14 = *cur_frame_idx;
          }
          iVar14 = iVar14 + 1;
          *cur_frame_idx = iVar14;
          iVar6 = uVar13 - (iVar4 + 1);
          iVar7 = start - uVar13;
          uVar9 = uVar13;
          iVar8 = uVar13 - uVar11;
          bVar2 = false;
        } while (bVar15);
        local_58[0] = uVar11;
        local_58[1] = (int)local_40 + 1;
        local_58[2] = iVar4 + 1;
        local_58[3] = start + -1;
        local_78[4] = (int)local_40;
        local_78[5] = iVar4;
        local_78[6] = uVar13;
        local_78[7] = start;
        local_78[0] = iVar16;
        local_78[1] = uVar3;
        local_78[2] = iVar16;
        local_78[3] = 0xffffffff;
        lVar5 = 0;
        do {
          set_multi_layer_params_for_fp
                    (twopass,twopass_frame,gf_group,p_rc,rc,(FRAME_INFO *)(ulong)local_58[lVar5],
                     local_78[lVar5 + 4],(int)piVar12,cur_frame_idx,frame_ind,
                     (int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
                     do_frame_parallel_encode,(int *)((ulong)first_frame_index & 0xffffffff),
                     depth_thr,(int *)(ulong)(uVar3 + 2),in_stack_ffffffffffffff38);
          piVar12 = (int *)CONCAT44(in_stack_00000014,end);
          iVar14 = local_78[lVar5];
          if (iVar14 != -1) {
            gf_group->update_type[*cur_frame_idx] = '\x05';
            gf_group->arf_src_offset[*cur_frame_idx] = '\0';
            gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar12;
            gf_group->layer_depth[*cur_frame_idx] = iVar14;
            gf_group->frame_type[*cur_frame_idx] = '\x01';
            gf_group->refbuf_state[*cur_frame_idx] = '\x01';
            iVar14 = *(int *)CONCAT44(in_stack_0000004c,depth_thr);
            gf_group->display_idx[*cur_frame_idx] = iVar14;
            *(int *)CONCAT44(in_stack_0000004c,depth_thr) = iVar14 + 1;
            iVar14 = *cur_frame_idx;
            if (0 < gf_group->frame_parallel_level[iVar14]) {
              iVar4 = *piVar12;
              if (gf_group->frame_parallel_level[iVar14] == 1) {
                *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar4;
                iVar6 = iVar4;
              }
              else {
                iVar6 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
              }
              gf_group->src_offset[iVar14] =
                   (iVar4 - iVar6) + (uint)gf_group->arf_src_offset[iVar14];
              iVar14 = *cur_frame_idx;
            }
            *cur_frame_idx = iVar14 + 1;
            *piVar12 = *piVar12 + 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        return;
      }
      uVar11 = (uint)cur_disp_idx + 1;
      piVar1 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
      set_multi_layer_params_for_fp
                (twopass,twopass_frame,gf_group,p_rc,rc,frame_info_00,iVar4,end,cur_frame_idx,
                 frame_ind,(int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
                 do_frame_parallel_encode,(int *)((ulong)first_frame_index & 0xffffffff),depth_thr,
                 (int *)(ulong)uVar11,in_stack_ffffffffffffff38);
      piVar12 = (int *)CONCAT44(in_stack_00000014,end);
      gf_group->update_type[*cur_frame_idx] = '\x05';
      gf_group->arf_src_offset[*cur_frame_idx] = '\0';
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar12;
      gf_group->layer_depth[*cur_frame_idx] = (uint)cur_disp_idx;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      iVar14 = *piVar1;
      gf_group->display_idx[*cur_frame_idx] = iVar14;
      *piVar1 = iVar14 + 1;
      iVar14 = *cur_frame_idx;
      if (0 < gf_group->frame_parallel_level[iVar14]) {
        iVar6 = *piVar12;
        if (gf_group->frame_parallel_level[iVar14] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
          iVar7 = iVar6;
        }
        else {
          iVar7 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        }
        gf_group->src_offset[iVar14] = (iVar6 - iVar7) + (uint)gf_group->arf_src_offset[iVar14];
        iVar14 = *cur_frame_idx;
      }
      *cur_frame_idx = iVar14 + 1;
      *piVar12 = *piVar12 + 1;
      uVar9 = iVar4 + 1;
      uVar10 = (ulong)uVar9;
    } while (((int)(uint)cur_disp_idx < gf_group->max_layer_depth_allowed) &&
            (frame_info_00 = (FRAME_INFO *)(ulong)uVar9, cur_disp_idx._0_4_ = uVar11,
            2 < (int)(start - uVar9)));
  }
  iVar14 = start - (int)uVar10;
  if (iVar14 != 0 && (int)uVar10 <= start) {
    do {
      gf_group->update_type[*cur_frame_idx] = '\x01';
      gf_group->arf_src_offset[*cur_frame_idx] = '\0';
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar12;
      gf_group->layer_depth[*cur_frame_idx] = 6;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      uVar3 = gf_group->max_layer_depth;
      if (gf_group->max_layer_depth <= (int)uVar11) {
        uVar3 = uVar11;
      }
      gf_group->max_layer_depth = uVar3;
      piVar12 = (int *)CONCAT44(in_stack_0000004c,depth_thr);
      gf_group->display_idx[*cur_frame_idx] = *piVar12;
      iVar4 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,(int)uVar10,iVar14,0,
                                 (int *)0x0,(int *)0x0,0);
      gf_group->arf_boost[*cur_frame_idx] = iVar4;
      *piVar12 = *piVar12 + 1;
      iVar4 = *cur_frame_idx;
      lVar5 = (long)iVar4;
      if (max_parallel_frames != 0) {
        gf_group->frame_parallel_level[lVar5] = (1 < *frame_ind) + 1;
        iVar4 = *frame_ind + 1;
        if ((int)parallel_frame_count <= *frame_ind) {
          iVar4 = 1;
        }
        *frame_ind = iVar4;
        iVar4 = *cur_frame_idx;
        lVar5 = (long)iVar4;
        gf_group->is_frame_non_ref[lVar5] = true;
      }
      piVar12 = (int *)CONCAT44(in_stack_00000014,end);
      if (0 < gf_group->frame_parallel_level[lVar5]) {
        iVar4 = *piVar12;
        if (gf_group->frame_parallel_level[lVar5] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar4;
          iVar6 = iVar4;
        }
        else {
          iVar6 = *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
        }
        gf_group->src_offset[lVar5] = (iVar4 - iVar6) + (uint)gf_group->arf_src_offset[lVar5];
        iVar4 = *cur_frame_idx;
      }
      *cur_frame_idx = iVar4 + 1;
      *piVar12 = *piVar12 + 1;
      uVar10 = (ulong)((int)uVar10 + 1);
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  return;
}

Assistant:

static void set_multi_layer_params_for_fp(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int depth_thr, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      set_params_for_leaf_frames(twopass, twopass_frame, p_rc, frame_info,
                                 gf_group, cur_frame_idx, frame_ind,
                                 parallel_frame_count, max_parallel_frames,
                                 do_frame_parallel_encode, first_frame_index,
                                 cur_disp_idx, layer_depth, start, end);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    int arf_src_offset = m - start;
    set_params_for_internal_arfs(
        twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
        frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, INT_MAX, cur_disp_idx,
        layer_depth, arf_src_offset, m, end - m, m - start);

    // If encode reordering is enabled, configure the multi-layers accordingly
    // and return. For e.g., the encode order for gf-interval 16 after
    // reordering would be 0-> 16-> 8-> 4-> 2-> 6-> 1-> 3-> 5-> 7-> 12-> 10->
    // 14-> 9-> 11-> 13-> 15.
    if (layer_depth >= depth_thr) {
      int m1 = (m + start - 1) / 2;
      int m2 = (m + 1 + end) / 2;
      int arf_src_offsets[2] = { m1 - start, m2 - start };
      // Parameters to compute arf_boost.
      int offset[2] = { m1, m2 };
      int f_frames[2] = { m - m1, end - m2 };
      int b_frames[2] = { m1 - start, m2 - (m + 1) };

      // Set GF_GROUP params for INTNL_ARF_UPDATE frames which are reordered.
      for (int i = 0; i < 2; i++) {
        set_params_for_internal_arfs(
            twopass, twopass_frame, p_rc, frame_info, gf_group, cur_frame_idx,
            frame_ind, parallel_frame_count, max_parallel_frames,
            do_frame_parallel_encode, first_frame_index, depth_thr,
            cur_disp_idx, layer_depth + 1, arf_src_offsets[i], offset[i],
            f_frames[i], b_frames[i]);
      }

      // Initialize the start and end indices to configure LF_UPDATE frames.
      int start_idx[4] = { start, m1 + 1, m + 1, end - 1 };
      int end_idx[4] = { m1, m, m2, end };
      int layer_depth_for_intnl_overlay[4] = { layer_depth + 1, layer_depth,
                                               layer_depth + 1, INVALID_IDX };

      // Set GF_GROUP params for the rest of LF_UPDATE and INTNL_OVERLAY_UPDATE
      // frames after reordering.
      for (int i = 0; i < 4; i++) {
        set_multi_layer_params_for_fp(
            twopass, twopass_frame, gf_group, p_rc, rc, frame_info,
            start_idx[i], end_idx[i], cur_frame_idx, frame_ind,
            parallel_frame_count, max_parallel_frames, do_frame_parallel_encode,
            first_frame_index, depth_thr, cur_disp_idx, layer_depth + 2);
        if (layer_depth_for_intnl_overlay[i] != INVALID_IDX)
          set_params_for_intnl_overlay_frames(
              gf_group, cur_frame_idx, frame_ind, first_frame_index,
              cur_disp_idx, layer_depth_for_intnl_overlay[i]);
      }
      return;
    }

    // Frames displayed before this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, start, m,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);

    // Overlay for internal ARF.
    set_params_for_intnl_overlay_frames(gf_group, cur_frame_idx, frame_ind,
                                        first_frame_index, cur_disp_idx,
                                        layer_depth);

    // Frames displayed after this internal ARF.
    set_multi_layer_params_for_fp(
        twopass, twopass_frame, gf_group, p_rc, rc, frame_info, m + 1, end,
        cur_frame_idx, frame_ind, parallel_frame_count, max_parallel_frames,
        do_frame_parallel_encode, first_frame_index, depth_thr, cur_disp_idx,
        layer_depth + 1);
  }
}